

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

void __thiscall HighsLp::userBoundScale(HighsLp *this,HighsInt user_bound_scale)

{
  reference pvVar1;
  int in_ESI;
  int *in_RDI;
  __type_conflict _Var2;
  HighsInt iRow;
  HighsInt iCol;
  double dl_user_bound_scale_value;
  HighsInt dl_user_bound_scale;
  int local_20;
  int local_1c;
  
  if (in_ESI != in_RDI[0x80]) {
    _Var2 = std::pow<int,int>(0,0x4f29af);
    for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)local_1c);
      *pvVar1 = _Var2 * *pvVar1;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_1c);
      *pvVar1 = _Var2 * *pvVar1;
    }
    for (local_20 = 0; local_20 < in_RDI[1]; local_20 = local_20 + 1) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14),(long)local_20)
      ;
      *pvVar1 = _Var2 * *pvVar1;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),(long)local_20)
      ;
      *pvVar1 = _Var2 * *pvVar1;
    }
    in_RDI[0x80] = in_ESI;
  }
  return;
}

Assistant:

void HighsLp::userBoundScale(const HighsInt user_bound_scale) {
  const HighsInt dl_user_bound_scale =
      user_bound_scale - this->user_bound_scale_;
  if (!dl_user_bound_scale) return;
  double dl_user_bound_scale_value = std::pow(2, dl_user_bound_scale);
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
    this->col_lower_[iCol] *= dl_user_bound_scale_value;
    this->col_upper_[iCol] *= dl_user_bound_scale_value;
  }
  for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
    this->row_lower_[iRow] *= dl_user_bound_scale_value;
    this->row_upper_[iRow] *= dl_user_bound_scale_value;
  }
  // Record the current user bound scaling applied to the LP
  this->user_bound_scale_ = user_bound_scale;
}